

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O3

string * __thiscall
tonk::ErrorResult::ToJson_abi_cxx11_(string *__return_storage_ptr__,ErrorResult *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  size_t sVar7;
  char *pcVar8;
  string *value;
  string *value_00;
  string *value_01;
  ulong uVar9;
  string *value_02;
  _Alloc_hider _Var10;
  uint __len;
  ulong __val;
  ostringstream oss;
  string local_208;
  string local_1e8;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{ \"source\": ",0xc);
  pcVar8 = this->Source;
  if (pcVar8 == (char *)0x0) {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    local_1e8.field_2._M_allocated_capacity._0_4_ = 0x6c6c756e;
    local_1e8._M_string_length = 4;
    local_1e8.field_2._M_local_buf[4] = '\0';
  }
  else {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    sVar7 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,pcVar8,pcVar8 + sVar7);
    JsonValue<std::__cxx11::string>(&local_1e8,(tonk *)&local_208,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  paVar1 = &local_1e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,", \"description\": ",0x11);
  pcVar3 = (this->Description)._M_dataplus._M_p;
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,pcVar3,pcVar3 + (this->Description)._M_string_length);
  JsonValue<std::__cxx11::string>(&local_208,(tonk *)local_1c8,value_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  paVar2 = &local_208.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", \"error_type\": ",0x10)
  ;
  if ((ulong)this->Type < 7) {
    pcVar8 = (&PTR_anon_var_dwarf_11a25f_001cf468)[this->Type];
  }
  else {
    pcVar8 = "Unknown";
  }
  local_208._M_dataplus._M_p = (pointer)paVar2;
  sVar7 = strlen(pcVar8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,pcVar8,pcVar8 + sVar7);
  JsonValue<std::__cxx11::string>(&local_1e8,(tonk *)&local_208,value_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if (this->Type == Tonk) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,", \"error_code\": ",0x10);
    pcVar8 = tonk_result_to_string((TonkResult)this->Code);
    if (pcVar8 == (char *)0x0) {
      local_1e8.field_2._M_allocated_capacity._0_4_ = 0x6c6c756e;
      local_1e8._M_string_length = 4;
      local_1e8.field_2._M_local_buf[4] = '\0';
      local_1e8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_208._M_dataplus._M_p = (pointer)paVar2;
      sVar7 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,pcVar8,pcVar8 + sVar7);
      JsonValue<std::__cxx11::string>(&local_1e8,(tonk *)&local_208,value_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    _Var10._M_p = local_1e8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p == paVar1) goto LAB_00151fc8;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,", \"error_code\": ",0x10);
    uVar4 = this->Code;
    __len = 1;
    __val = -uVar4;
    if (0 < (long)uVar4) {
      __val = uVar4;
    }
    if (9 < __val) {
      uVar9 = __val;
      uVar6 = 4;
      do {
        __len = uVar6;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_00151f7d;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_00151f7d;
        }
        if (uVar9 < 10000) goto LAB_00151f7d;
        bVar5 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        uVar6 = __len + 4;
      } while (bVar5);
      __len = __len + 1;
    }
LAB_00151f7d:
    local_208._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_208,(char)__len - (char)((long)uVar4 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_208._M_dataplus._M_p + -((long)uVar4 >> 0x3f),__len,__val);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    _Var10._M_p = local_208._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p == paVar2) goto LAB_00151fc8;
  }
  operator_delete(_Var10._M_p);
LAB_00151fc8:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," }",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string ErrorResult::ToJson() const
{
    std::ostringstream oss;
    oss << "{ \"source\": " << JsonValue(Source);
    oss << ", \"description\": " << JsonValue(Description);
    oss << ", \"error_type\": " << JsonValue(ErrorTypeToString(Type));
    if (Type == ErrorType::Tonk)
        oss << ", \"error_code\": " << JsonValue(tonk_result_to_string((TonkResult)Code));
    else
        oss << ", \"error_code\": " << JsonValue(Code);
    oss << " }";
    return oss.str();
}